

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O3

int luckyCheck(word *pAfter,word *pBefore,int nVars,char *pCanonPerm,uint uCanonPhase)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint local_3c;
  word *local_38;
  
  local_3c = uCanonPhase;
  if (0 < nVars) {
    uVar3 = 0;
    local_38 = pBefore;
    do {
      uVar2 = uVar3;
      do {
        if ((char)((char)uVar3 + 'a') == pCanonPerm[uVar2]) {
          swapAndFlip(pAfter,nVars,(int)uVar3,(int)uVar2,pCanonPerm,&local_3c);
          break;
        }
        uVar2 = uVar2 + 1;
      } while ((uint)nVars != uVar2);
      uVar3 = uVar3 + 1;
      pBefore = local_38;
    } while (uVar3 != (uint)nVars);
  }
  if ((local_3c >> (nVars & 0x1fU) & 1) != 0) {
    Kit_TruthNot_64bit(pAfter,nVars);
  }
  iVar1 = Kit_TruthWordNum_64bit(nVars);
  iVar1 = bcmp(pAfter,pBefore,(long)iVar1 << 3);
  return (int)(iVar1 != 0);
}

Assistant:

int luckyCheck(word* pAfter, word* pBefore, int nVars, char * pCanonPerm, unsigned uCanonPhase)
{
    int i,j;
    char tempChar;
    for(j=0;j<nVars;j++)
    {
        tempChar = 'a'+ j;
        for(i=j;i<nVars;i++)
        {
            if(tempChar != pCanonPerm[i])
                continue;
            swapAndFlip(pAfter , nVars, j, i, pCanonPerm, &uCanonPhase);
            break;
        }
    }
    if((uCanonPhase>>nVars) & 1)
        Kit_TruthNot_64bit(pAfter, nVars );
    if(memcmp(pAfter, pBefore, Kit_TruthWordNum_64bit( nVars )*sizeof(word)) == 0)
        return 0;
    else
        return 1;
}